

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O3

void duckdb::TupleDataTemplatedWithinCollectionGather<int>
               (TupleDataLayout *param_1,Vector *heap_locations,idx_t list_size_before,
               SelectionVector *param_4,idx_t scan_count,Vector *target,SelectionVector *target_sel,
               optional_ptr<duckdb::Vector,_true> list_vector,
               vector<duckdb::TupleDataGatherFunction,_true> *param_9)

{
  unsigned_long *puVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  data_ptr_t pdVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  ulong uVar9;
  ulong uVar10;
  data_ptr_t pdVar11;
  long lVar12;
  optional_ptr<duckdb::Vector,_true> oVar13;
  idx_t child_i;
  ulong uVar14;
  idx_t local_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  Vector *local_78;
  data_ptr_t local_70;
  ulong local_68;
  data_ptr_t local_60;
  data_ptr_t local_58;
  ulong local_50;
  buffer_ptr<ValidityBuffer> *local_48;
  idx_t local_40;
  optional_ptr<duckdb::Vector,_true> local_38;
  
  local_38.ptr = list_vector.ptr;
  optional_ptr<duckdb::Vector,_true>::CheckValid(&local_38);
  pdVar11 = (local_38.ptr)->data;
  optional_ptr<duckdb::Vector,_true>::CheckValid(&local_38);
  oVar13.ptr = local_38.ptr;
  FlatVector::VerifyFlatVector(local_38.ptr);
  local_58 = heap_locations->data;
  local_60 = target->data;
  FlatVector::VerifyFlatVector(target);
  if (scan_count != 0) {
    local_48 = &(target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    local_50 = 0;
    local_78 = oVar13.ptr;
    local_90 = list_size_before;
    local_70 = pdVar11;
    local_68 = scan_count;
    do {
      pdVar6 = local_60;
      uVar10 = local_50;
      if (target_sel->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)target_sel->sel_vector[local_50];
      }
      puVar1 = ((oVar13.ptr)->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)) {
        uVar9 = *(ulong *)(pdVar11 + uVar10 * 0x10 + 8);
        if (uVar9 != 0) {
          lVar2 = *(long *)(local_58 + local_50 * 8);
          lVar12 = (uVar9 + 7 >> 3) + lVar2;
          *(ulong *)(local_58 + local_50 * 8) = uVar9 * 4 + lVar12;
          uVar14 = 0;
          do {
            if ((*(byte *)(lVar2 + (uVar14 >> 3)) >> ((uint)uVar14 & 7) & 1) == 0) {
              _Var8._M_head_impl =
                   (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (_Var8._M_head_impl == (unsigned_long *)0x0) {
                local_40 = (target->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_88,&local_40);
                p_Var5 = p_Stack_80;
                peVar4 = local_88;
                local_88 = (element_type *)0x0;
                p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                this = (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
                (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar4;
                (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var5;
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
                  }
                }
                pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_48);
                _Var8._M_head_impl =
                     (pTVar7->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var8._M_head_impl;
              }
              bVar3 = (byte)(local_90 + uVar14) & 0x3f;
              _Var8._M_head_impl[local_90 + uVar14 >> 6] =
                   _Var8._M_head_impl[local_90 + uVar14 >> 6] &
                   (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
              uVar9 = *(ulong *)(pdVar11 + uVar10 * 0x10 + 8);
            }
            else {
              *(undefined4 *)(pdVar6 + uVar14 * 4 + local_90 * 4) =
                   *(undefined4 *)(lVar12 + uVar14 * 4);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < uVar9);
          local_90 = local_90 + uVar9;
          pdVar11 = local_70;
          oVar13.ptr = local_78;
          scan_count = local_68;
        }
      }
      local_50 = local_50 + 1;
    } while (local_50 != scan_count);
  }
  return;
}

Assistant:

static void
TupleDataTemplatedWithinCollectionGather(const TupleDataLayout &, Vector &heap_locations, const idx_t list_size_before,
                                         const SelectionVector &, const idx_t scan_count, Vector &target,
                                         const SelectionVector &target_sel, optional_ptr<Vector> list_vector,
                                         const vector<TupleDataGatherFunction> &) {
	// List parent
	const auto list_entries = FlatVector::GetData<list_entry_t>(*list_vector);
	const auto &list_validity = FlatVector::Validity(*list_vector);

	// Source
	const auto source_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Target
	const auto target_data = FlatVector::GetData<T>(target);
	auto &target_validity = FlatVector::Validity(target);

	uint64_t target_offset = list_size_before;
	for (idx_t i = 0; i < scan_count; i++) {
		const auto target_idx = target_sel.get_index(i);
		if (!list_validity.RowIsValid(target_idx)) {
			continue;
		}

		const auto &list_length = list_entries[target_idx].length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask
		auto &source_heap_location = source_heap_locations[i];
		ValidityBytes source_mask(source_heap_location, list_length);
		source_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Get the start to the fixed-size data and skip the heap pointer over it
		const auto source_data_location = source_heap_location;
		source_heap_location += list_length * TupleDataWithinListFixedSize<T>();

		// Load the child validity and data belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			if (source_mask.RowIsValidUnsafe(child_i)) {
				auto &target_value = target_data[target_offset + child_i];
				target_value = TupleDataWithinListValueLoad<T>(
				    source_data_location + child_i * TupleDataWithinListFixedSize<T>(), source_heap_location);
				TupleDataValueVerify(target.GetType(), target_value);
			} else {
				target_validity.SetInvalid(target_offset + child_i);
			}
		}
		target_offset += list_length;
	}
}